

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void * ndiHexDecode(void *data,char *cp,int n)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int local_38;
  uint d;
  int c2;
  int c1;
  int i;
  uchar *bdata;
  char *pcStack_18;
  int n_local;
  char *cp_local;
  void *data_local;
  
  pcStack_18 = cp;
  for (c2 = 0; c2 < n; c2 = c2 + 1) {
    local_38 = 0;
    pcVar3 = pcStack_18 + 1;
    iVar2 = (int)*pcStack_18;
    if ((iVar2 < 0x61) || (0x66 < iVar2)) {
      if ((iVar2 < 0x41) || (0x46 < iVar2)) {
        if ((0x2f < iVar2) && (iVar2 < 0x3a)) {
          local_38 = iVar2 + -0x30;
        }
      }
      else {
        local_38 = iVar2 + -0x37;
      }
    }
    else {
      local_38 = iVar2 + -0x57;
    }
    pcStack_18 = pcStack_18 + 2;
    cVar1 = *pcVar3;
    local_38._0_1_ = (byte)(local_38 << 4);
    if ((cVar1 < 'a') || ('f' < cVar1)) {
      if ((cVar1 < 'A') || ('F' < cVar1)) {
        if (('/' < cVar1) && (cVar1 < ':')) {
          local_38._0_1_ = cVar1 - 0x30U | (byte)local_38;
        }
      }
      else {
        local_38._0_1_ = cVar1 - 0x37U | (byte)local_38;
      }
    }
    else {
      local_38._0_1_ = cVar1 + 0xa9U | (byte)local_38;
    }
    *(byte *)((long)data + (long)c2) = (byte)local_38;
  }
  return data;
}

Assistant:

ndicapiExport void* ndiHexDecode(void* data, const char* cp, int n)
{
  unsigned char* bdata;
  int i, c1, c2;
  unsigned int d;

  bdata = (unsigned char*)data;

  for (i = 0; i < n; i++)
  {
    d = 0;
    c1 = *cp++;
    if (c1 >= 'a' && c1 <= 'f')
    {
      d = (c1 + (10 - 'a'));
    }
    else if (c1 >= 'A' && c1 <= 'F')
    {
      d = (c1 + (10 - 'A'));
    }
    else if (c1 >= '0' && c1 <= '9')
    {
      d = (c1 - '0');
    }
    c2 = *cp++;
    d <<= 4;
    if (c2 >= 'a' && c2 <= 'f')
    {
      d |= (c2 + (10 - 'a'));
    }
    else if (c2 >= 'A' && c2 <= 'F')
    {
      d |= (c2 + (10 - 'A'));
    }
    else if (c2 >= '0' && c2 <= '9')
    {
      d |= (c2 - '0');
    }

    bdata[i] = d;
  }

  return data;
}